

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall cmGeneratorTarget::AddSourceCommon(cmGeneratorTarget *this,string *src,bool before)

{
  undefined1 local_98 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_68;
  undefined1 local_38 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_28;
  element_type *peStack_18;
  bool before_local;
  string *src_local;
  cmGeneratorTarget *this_local;
  
  local_28._M_local_buf[0xf] = before;
  peStack_18 = (element_type *)src;
  src_local = (string *)this;
  if (before) {
    local_38._8_8_ =
         std::
         vector<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>_>_>
         ::begin(&this->SourceEntries);
  }
  else {
    local_38._8_8_ =
         std::
         vector<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>_>_>
         ::end(&this->SourceEntries);
  }
  __gnu_cxx::
  __normal_iterator<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,std::default_delete<cmGeneratorTarget::TargetPropertyEntry>>const*,std::vector<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,std::default_delete<cmGeneratorTarget::TargetPropertyEntry>>,std::allocator<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,std::default_delete<cmGeneratorTarget::TargetPropertyEntry>>>>>
  ::
  __normal_iterator<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,std::default_delete<cmGeneratorTarget::TargetPropertyEntry>>*>
            ((__normal_iterator<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,std::default_delete<cmGeneratorTarget::TargetPropertyEntry>>const*,std::vector<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,std::default_delete<cmGeneratorTarget::TargetPropertyEntry>>,std::allocator<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,std::default_delete<cmGeneratorTarget::TargetPropertyEntry>>>>>
              *)(local_38 + 0x10),
             (__normal_iterator<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>_>_>_>
              *)(local_38 + 8));
  std::__cxx11::string::string((string *)(local_98 + 0x10),(string *)peStack_18);
  cmMakefile::GetBacktrace((cmMakefile *)local_98);
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
            ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
             )(local_98 + 0x30),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_98 + 0x10),
             (cmListFileBacktrace *)local_98);
  CreateTargetPropertyEntry
            ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
             )local_38,(bool)((char)local_98 + '0'));
  std::
  vector<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>_>_>
  ::insert(&this->SourceEntries,(const_iterator)local_28._M_allocated_capacity,
           (value_type *)local_38);
  std::
  unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>
  ::~unique_ptr((unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>
                 *)local_38);
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
            ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
             )(local_98 + 0x30));
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_98);
  std::__cxx11::string::~string((string *)(local_98 + 0x10));
  ClearSourcesCache(this);
  return;
}

Assistant:

void cmGeneratorTarget::AddSourceCommon(const std::string& src, bool before)
{
  this->SourceEntries.insert(
    before ? this->SourceEntries.begin() : this->SourceEntries.end(),
    CreateTargetPropertyEntry(
      BT<std::string>(src, this->Makefile->GetBacktrace()), true));
  this->ClearSourcesCache();
}